

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

string * __thiscall
pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CuboidMedium<pbrt::NanoVDBMediumProvider> *this)

{
  Point3<int> *in_RAX;
  
  StringPrintf<pbrt::NanoVDBMediumProvider_const&,pbrt::Bounds3<float>const&,pbrt::DenselySampledSpectrum_const&,pbrt::DenselySampledSpectrum_const&,float_const&,pbrt::HGPhaseFunction_const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pbrt::Point3<int>const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ CuboidMedium provider: %s mediumBounds: %s sigma_a_spec: %s sigma_s_spec: %s sigScale: %f phase: %s maxDensityGrid: %s gridResolution: %s ]"
             ,(char *)this->provider,(NanoVDBMediumProvider *)&this->mediumBounds,
             (Bounds3<float> *)&this->sigma_a_spec,&this->sigma_s_spec,
             (DenselySampledSpectrum *)&this->sigScale,&(this->phase).g,
             (HGPhaseFunction *)&this->maxDensityGrid,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&this->gridResolution,in_RAX
            );
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ CuboidMedium provider: %s mediumBounds: %s "
                            "sigma_a_spec: %s sigma_s_spec: %s sigScale: %f phase: %s "
                            "maxDensityGrid: %s gridResolution: %s ]",
                            *provider, mediumBounds, sigma_a_spec, sigma_s_spec, sigScale,
                            phase, maxDensityGrid, gridResolution);
    }